

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O1

void __thiscall
cuckoocache_tests::test_cuckoocache_no_fakes::test_method(test_cuckoocache_no_fakes *this)

{
  pointer puVar1;
  uchar *puVar2;
  uint uVar3;
  uint256 e;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  FastRandomContext *this_00;
  int iVar8;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Span<std::byte> output;
  const_string file;
  Span<std::byte> output_00;
  const_string msg;
  cache<uint256,_SignatureCacheHasher> cc;
  uint256 ret_1;
  uint256 ret;
  check_type cVar13;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  assertion_result local_130;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  cache<uint256,_SignatureCacheHasher> local_f8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  check_type cStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  lazy_ostream local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,ZEROS);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_f8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_f8,0x20000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar8 = 100000;
  do {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    _cStack_70 = CHECK_PRED;
    output.m_size = 0x20;
    output.m_data = (byte *)&local_78;
    FastRandomContext::fillrand(this_00,output);
    e.super_base_blob<256U>.m_data._M_elems[8] = (undefined1)cStack_70;
    e.super_base_blob<256U>.m_data._M_elems[9] = cStack_70._1_1_;
    e.super_base_blob<256U>.m_data._M_elems[10] = cStack_70._2_1_;
    e.super_base_blob<256U>.m_data._M_elems[0xb] = cStack_70._3_1_;
    e.super_base_blob<256U>.m_data._M_elems[0] = (undefined1)local_78;
    e.super_base_blob<256U>.m_data._M_elems[1] = local_78._1_1_;
    e.super_base_blob<256U>.m_data._M_elems[2] = local_78._2_1_;
    e.super_base_blob<256U>.m_data._M_elems[3] = local_78._3_1_;
    e.super_base_blob<256U>.m_data._M_elems[4] = local_78._4_1_;
    e.super_base_blob<256U>.m_data._M_elems[5] = local_78._5_1_;
    e.super_base_blob<256U>.m_data._M_elems[6] = local_78._6_1_;
    e.super_base_blob<256U>.m_data._M_elems[7] = local_78._7_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x10] = (undefined1)local_68;
    e.super_base_blob<256U>.m_data._M_elems[0x11] = local_68._1_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x12] = local_68._2_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x13] = local_68._3_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x14] = local_68._4_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x15] = local_68._5_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x16] = local_68._6_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x17] = local_68._7_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)uStack_60;
    e.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_60._1_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_60._2_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_60._3_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_60._4_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_60._5_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_60._6_1_;
    e.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_60._7_1_;
    _cVar13 = _cStack_70;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&local_f8,e);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  iVar8 = 0;
  do {
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x30;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    output_00.m_size = 0x20;
    output_00.m_data = local_98;
    FastRandomContext::fillrand(this_00,output_00);
    uVar6 = (ulong)local_f8.size;
    uVar5 = (uint)local_98._0_4_ * uVar6 >> 0x20;
    local_58._8_4_ = SUB84((uint)local_98._8_4_ * uVar6 >> 0x20,0);
    local_58._12_4_ = (int)((uint)local_98._12_4_ * uVar6 >> 0x20);
    local_48 = (undefined1 *)
               CONCAT44((int)((uint)local_88._4_4_ * uVar6 >> 0x20),
                        (int)((uint)local_88._0_4_ * uVar6 >> 0x20));
    local_40 = (char **)CONCAT44((int)((uint)local_88._12_4_ * uVar6 >> 0x20),
                                 (int)((uint)local_88._8_4_ * uVar6 >> 0x20));
    puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5;
    puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5].super_base_blob<256U>.m_data._M_elems + 0x10;
    auVar11[0] = -(*puVar2 == local_88[0]);
    auVar11[1] = -(puVar2[1] == local_88[1]);
    auVar11[2] = -(puVar2[2] == local_88[2]);
    auVar11[3] = -(puVar2[3] == local_88[3]);
    auVar11[4] = -(puVar2[4] == local_88[4]);
    auVar11[5] = -(puVar2[5] == local_88[5]);
    auVar11[6] = -(puVar2[6] == local_88[6]);
    auVar11[7] = -(puVar2[7] == local_88[7]);
    auVar11[8] = -(puVar2[8] == local_88[8]);
    auVar11[9] = -(puVar2[9] == local_88[9]);
    auVar11[10] = -(puVar2[10] == local_88[10]);
    auVar11[0xb] = -(puVar2[0xb] == local_88[0xb]);
    auVar11[0xc] = -(puVar2[0xc] == local_88[0xc]);
    auVar11[0xd] = -(puVar2[0xd] == local_88[0xd]);
    auVar11[0xe] = -(puVar2[0xe] == local_88[0xe]);
    auVar11[0xf] = -(puVar2[0xf] == local_88[0xf]);
    auVar9[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_98[0]);
    auVar9[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == local_98[1]);
    auVar9[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == local_98[2]);
    auVar9[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == local_98[3]);
    auVar9[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == local_98[4]);
    auVar9[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == local_98[5]);
    auVar9[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == local_98[6]);
    auVar9[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == local_98[7]);
    auVar9[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == local_98[8]);
    auVar9[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == local_98[9]);
    auVar9[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == local_98[10]);
    auVar9[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == local_98[0xb]);
    auVar9[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == local_98[0xc]);
    auVar9[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == local_98[0xd]);
    auVar9[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == local_98[0xe]);
    auVar9[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == local_98[0xf]);
    auVar9 = auVar9 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
      local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
    else {
      lVar4 = 4;
      do {
        lVar7 = lVar4;
        if (lVar7 == 0x20) break;
        uVar3 = *(uint *)((long)&local_58._vptr_lazy_ostream + lVar7);
        puVar1 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        puVar2 = local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3].super_base_blob<256U>.m_data._M_elems +
                 0x10;
        auVar12[0] = -(*puVar2 == local_88[0]);
        auVar12[1] = -(puVar2[1] == local_88[1]);
        auVar12[2] = -(puVar2[2] == local_88[2]);
        auVar12[3] = -(puVar2[3] == local_88[3]);
        auVar12[4] = -(puVar2[4] == local_88[4]);
        auVar12[5] = -(puVar2[5] == local_88[5]);
        auVar12[6] = -(puVar2[6] == local_88[6]);
        auVar12[7] = -(puVar2[7] == local_88[7]);
        auVar12[8] = -(puVar2[8] == local_88[8]);
        auVar12[9] = -(puVar2[9] == local_88[9]);
        auVar12[10] = -(puVar2[10] == local_88[10]);
        auVar12[0xb] = -(puVar2[0xb] == local_88[0xb]);
        auVar12[0xc] = -(puVar2[0xc] == local_88[0xc]);
        auVar12[0xd] = -(puVar2[0xd] == local_88[0xd]);
        auVar12[0xe] = -(puVar2[0xe] == local_88[0xe]);
        auVar12[0xf] = -(puVar2[0xf] == local_88[0xf]);
        auVar10[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_98[0]);
        auVar10[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == local_98[1]);
        auVar10[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == local_98[2]);
        auVar10[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == local_98[3]);
        auVar10[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == local_98[4]);
        auVar10[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == local_98[5]);
        auVar10[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == local_98[6]);
        auVar10[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == local_98[7]);
        auVar10[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == local_98[8]);
        auVar10[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == local_98[9]);
        auVar10[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == local_98[10]);
        auVar10[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == local_98[0xb]);
        auVar10[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == local_98[0xc]);
        auVar10[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == local_98[0xd]);
        auVar10[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == local_98[0xe]);
        auVar10[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == local_98[0xf]);
        auVar10 = auVar10 & auVar12;
        lVar4 = lVar7 + 4;
      } while ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff);
      local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(lVar7 == 0x20);
    }
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_140 = "!cc.contains(m_rng.rand256(), false)";
    local_138 = "";
    local_58._8_4_ = local_58._8_4_ & 0xffffff00;
    local_58._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_48 = boost::unit_test::lazy_ostream::inst;
    local_40 = &local_140;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cuckoocache_tests.cpp"
    ;
    local_148 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,&local_58,1,0,WARN,_cVar13,(size_t)&local_150,0x30);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
    iVar8 = iVar8 + 1;
    if (iVar8 == 100000) {
      if (local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage -
                        (long)local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p);
        local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_f8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_f8.collection_flags.mem._M_t.
          super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
          .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
          (__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
           )0x0) {
        operator_delete__((void *)local_f8.collection_flags.mem._M_t.
                                  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                                  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                                  _M_head_impl);
      }
      local_f8.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
           (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
            )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
              )0x0;
      if (local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(test_cuckoocache_no_fakes)
{
    SeedRandomForTest(SeedRand::ZEROS);
    CuckooCache::cache<uint256, SignatureCacheHasher> cc{};
    size_t megabytes = 4;
    cc.setup_bytes(megabytes << 20);
    for (int x = 0; x < 100000; ++x) {
        cc.insert(m_rng.rand256());
    }
    for (int x = 0; x < 100000; ++x) {
        BOOST_CHECK(!cc.contains(m_rng.rand256(), false));
    }
}